

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O0

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,istream *input)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  const_iterator local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  undefined1 local_1f2;
  allocator local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  iterator local_1c8;
  size_type local_1c0;
  string local_1b8;
  string local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string local_160;
  undefined1 local_140 [8];
  string item;
  string local_100;
  long local_e0;
  size_type pos;
  ini_ret_t *out;
  ulong local_b0;
  size_t len;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  allocator local_79;
  undefined1 local_78 [8];
  string section;
  string line;
  string name;
  istream *input_local;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *output;
  
  ::std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(section.field_2._M_local_buf + 8));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_78,"default",&local_79);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::vector
            (__return_storage_ptr__);
  while( true ) {
    piVar2 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)(section.field_2._M_local_buf + 8));
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&len);
    trim((string *)((long)&section.field_2 + 8));
    local_b0 = ::std::__cxx11::string::length();
    if (((local_b0 < 2) ||
        (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
        *pcVar3 != '[')) ||
       (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
       *pcVar3 != ']')) {
      if ((local_b0 != 0) &&
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
         *pcVar3 != ';')) {
        std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::emplace_back<>
                  (__return_storage_ptr__);
        pos = (size_type)
              std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::back
                        (__return_storage_ptr__);
        local_e0 = ::std::__cxx11::string::find(section.field_2._M_local_buf + 8,0x18d7ce);
        if (local_e0 == -1) {
          trim_copy(&local_1b8,(string *)((long)&section.field_2 + 8));
          ::std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),(string *)&local_1b8);
          ::std::__cxx11::string::~string((string *)&local_1b8);
          local_1f2 = 1;
          local_1f0 = &local_1e8;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1e8,"ON",&local_1f1);
          local_1f2 = 0;
          local_1c8 = &local_1e8;
          local_1c0 = 1;
          __l._M_len = 1;
          __l._M_array = local_1c8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&len,__l);
          local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1c8;
          do {
            local_308 = local_308 + -1;
            ::std::__cxx11::string::~string((string *)local_308);
          } while (local_308 != &local_1e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        }
        else {
          ::std::__cxx11::string::substr
                    ((ulong)((long)&item.field_2 + 8),(ulong)((long)&section.field_2 + 8));
          trim_copy(&local_100,(string *)((long)&item.field_2 + 8));
          ::std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),(string *)&local_100);
          ::std::__cxx11::string::~string((string *)&local_100);
          ::std::__cxx11::string::~string((string *)(item.field_2._M_local_buf + 8));
          ::std::__cxx11::string::substr((ulong)&local_160,(ulong)((long)&section.field_2 + 8));
          trim_copy((string *)local_140,&local_160);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::string((string *)&local_198,(string *)local_140);
          split_up(&local_178,&local_198);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&len,&local_178);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          ::std::__cxx11::string::~string((string *)&local_198);
          ::std::__cxx11::string::~string((string *)local_140);
        }
        ::std::__cxx11::string::string((string *)&local_238,(string *)local_78);
        to_lower(&local_218,&local_238);
        bVar1 = ::std::operator==(&local_218,"default");
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_238);
        if (bVar1) {
          ::std::__cxx11::string::operator=((string *)pos,(string *)(line.field_2._M_local_buf + 8))
          ;
        }
        else {
          ::std::operator+(&local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,".");
          ::std::operator+(&local_258,&local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&line.field_2 + 8));
          ::std::__cxx11::string::operator=((string *)pos,(string *)&local_258);
          ::std::__cxx11::string::~string((string *)&local_258);
          ::std::__cxx11::string::~string((string *)&local_278);
        }
        this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(pos + 0x20);
        local_288._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_280,&local_288);
        __first = ::std::
                  begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&len);
        __last = ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&len);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  (this,local_280,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
      }
    }
    else {
      ::std::__cxx11::string::substr((ulong)&out,(ulong)((long)&section.field_2 + 8));
      ::std::__cxx11::string::operator=((string *)local_78,(string *)&out);
      ::std::__cxx11::string::~string((string *)&out);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&len);
  }
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)(section.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(std::istream &input) {
    std::string name, line;
    std::string section = "default";

    std::vector<ini_ret_t> output;

    while(getline(input, line)) {
        std::vector<std::string> items;

        detail::trim(line);
        size_t len = line.length();
        if(len > 1 && line[0] == '[' && line[len - 1] == ']') {
            section = line.substr(1, len - 2);
        } else if(len > 0 && line[0] != ';') {
            output.emplace_back();
            ini_ret_t &out = output.back();

            // Find = in string, split and recombine
            auto pos = line.find("=");
            if(pos != std::string::npos) {
                name = detail::trim_copy(line.substr(0, pos));
                std::string item = detail::trim_copy(line.substr(pos + 1));
                items = detail::split_up(item);
            } else {
                name = detail::trim_copy(line);
                items = {"ON"};
            }

            if(detail::to_lower(section) == "default")
                out.fullname = name;
            else
                out.fullname = section + "." + name;

            out.inputs.insert(std::end(out.inputs), std::begin(items), std::end(items));
        }
    }
    return output;
}